

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,Indent *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,StringTree *params_6,ArrayPtr<const_char> *params_7,
          StringTree *params_8,StringTree *params_9,ArrayPtr<const_char> *params_10)

{
  size_t sVar1;
  char *pcVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_c0;
  StringTree *local_a8;
  ArrayPtr<const_char> *local_a0;
  ArrayPtr<const_char> *local_98;
  ArrayPtr<const_char> *local_90;
  ulong local_88;
  undefined8 uStack_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  size_t sStack_60;
  char *local_58;
  char *local_50;
  char *local_48;
  size_t sStack_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_88 = (ulong)(uint)this->size_;
  uStack_80 = *(undefined8 *)(params + 2);
  local_78 = params_1->size_;
  sStack_70 = params_2->size_;
  local_68 = params_3->size_;
  sStack_60 = params_4->size_;
  local_58 = params_5->ptr;
  local_50 = (params_6->text).content.ptr;
  local_48 = params_7->ptr;
  sStack_40 = params_8->size_;
  local_38 = (params_9->text).content.ptr;
  nums._M_len = (size_type)params_7;
  nums._M_array = (iterator)0xb;
  sVar1 = _::sum((_ *)&local_88,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_88 = (ulong)(uint)this->size_;
  uStack_80 = *(undefined8 *)(params + 2);
  local_78 = params_1->size_;
  sStack_70 = params_2->size_;
  local_68 = params_3->size_;
  sStack_60 = params_4->size_;
  local_58 = (char *)0x0;
  local_50 = (params_6->text).content.ptr;
  local_48 = (char *)0x0;
  sStack_40 = 0;
  local_38 = (params_9->text).content.ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xb;
  local_a8 = this;
  local_a0 = (ArrayPtr<const_char> *)params;
  local_98 = params_1;
  local_90 = params_2;
  sVar1 = _::sum((_ *)&local_88,nums_00);
  heapString((String *)&local_c0,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_c0);
  Array<char>::~Array((Array<char> *)&local_c0);
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_58 = (char *)0x1;
  local_50 = (char *)0x0;
  local_48 = (char *)0x1;
  sStack_40 = 1;
  local_38 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xb;
  sVar1 = _::sum((_ *)&local_88,nums_01);
  local_c0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_c0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_c0.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_c0);
  Array<kj::StringTree::Branch>::~Array(&local_c0);
  pcVar2 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (__return_storage_ptr__->text).content.ptr;
  }
  pcVar2 = _::fill<capnp::(anonymous_namespace)::Indent>(pcVar2,(Indent *)local_a8);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar2,0,local_a0,local_98,local_90,params_3,params_4,
             (StringTree *)params_5,(ArrayPtr<const_char> *)params_6,(StringTree *)params_7,params_8
             ,(ArrayPtr<const_char> *)params_9);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}